

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xmlBufAttrSerializeTxtContent(xmlBufPtr buf,xmlDocPtr doc,xmlAttrPtr attr,xmlChar *string)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  char *str;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  long lStack_60;
  uchar tmp [12];
  
  if (string != (xmlChar *)0x0) {
    pbVar6 = string;
LAB_001a809e:
    while( true ) {
      bVar1 = *pbVar6;
      iVar5 = (int)pbVar6;
      iVar4 = (int)string;
      if (bVar1 == 9) {
        if (string != pbVar6) {
          xmlBufAdd(buf,string,iVar5 - iVar4);
        }
        str = "&#9;";
        goto LAB_001a8197;
      }
      if (bVar1 != 10) break;
      if (string != pbVar6) {
        xmlBufAdd(buf,string,iVar5 - iVar4);
      }
      str = "&#10;";
LAB_001a81dd:
      iVar4 = 5;
LAB_001a81e0:
      xmlBufAdd(buf,(xmlChar *)str,iVar4);
      string = pbVar6 + 1;
      pbVar6 = string;
    }
    if (bVar1 == 0xd) {
      if (string != pbVar6) {
        xmlBufAdd(buf,string,iVar5 - iVar4);
      }
      str = "&#13;";
      goto LAB_001a81dd;
    }
    if (bVar1 == 0x22) {
      if (string != pbVar6) {
        xmlBufAdd(buf,string,iVar5 - iVar4);
      }
      str = "&quot;";
      iVar4 = 6;
      goto LAB_001a81e0;
    }
    if (bVar1 == 0x26) {
      if (string != pbVar6) {
        xmlBufAdd(buf,string,iVar5 - iVar4);
      }
      str = "&amp;";
      goto LAB_001a81dd;
    }
    if (bVar1 == 0x3c) {
      if (string != pbVar6) {
        xmlBufAdd(buf,string,iVar5 - iVar4);
      }
      str = "&lt;";
LAB_001a8197:
      iVar4 = 4;
      goto LAB_001a81e0;
    }
    if (bVar1 == 0x3e) {
      str = "&gt;";
      if (string != pbVar6) {
        xmlBufAdd(buf,string,iVar5 - iVar4);
      }
      goto LAB_001a8197;
    }
    if (bVar1 != 0) {
      if ((((char)bVar1 < '\0') && (pbVar6[1] != 0)) &&
         ((doc == (xmlDocPtr)0x0 || (doc->encoding == (xmlChar *)0x0)))) {
        if (string != pbVar6) {
          xmlBufAdd(buf,string,iVar5 - iVar4);
          bVar1 = *pbVar6;
        }
        string = pbVar6 + 1;
        iVar4 = 0x578;
        if (bVar1 < 0xc0) goto LAB_001a8352;
        if (bVar1 < 0xe0) {
          uVar3 = (bVar1 & 0x1f) << 6;
          bVar2 = *string;
          lStack_60 = 2;
LAB_001a82c0:
          uVar3 = bVar2 & 0x3f | uVar3;
          if (uVar3 < 0x100) {
            if ((uVar3 < 0x20) &&
               ((iVar4 = 0x579, 0xd < uVar3 || ((0x2600U >> ((bVar2 & 0x3f) & 0x1f) & 1) == 0))))
            goto LAB_001a8352;
          }
          else {
            iVar4 = 0x579;
            if (0xfffff < uVar3 - 0x10000 && (0x1ffd < uVar3 - 0xe000 && 0xd7ff < uVar3))
            goto LAB_001a8352;
          }
          xmlSerializeHexCharRef(tmp,uVar3);
          xmlBufAdd(buf,tmp,-1);
          string = pbVar6 + lStack_60;
          pbVar6 = string;
        }
        else {
          if (bVar1 < 0xf0) {
            bVar2 = pbVar6[2];
            if (bVar2 != 0) {
              uVar3 = (*string & 0x3f | (bVar1 & 0xf) << 6) << 6;
              lStack_60 = 3;
              goto LAB_001a82c0;
            }
            iVar4 = 0x579;
          }
          else {
            iVar4 = 0x579;
            if (((bVar1 < 0xf8) && (pbVar6[2] != 0)) && (bVar2 = pbVar6[3], bVar2 != 0)) {
              uVar3 = (pbVar6[2] & 0x3f | (*string & 0x3f) << 6 | (bVar1 & 7) << 0xc) << 6;
              lStack_60 = 4;
              goto LAB_001a82c0;
            }
          }
LAB_001a8352:
          xmlSaveErr(iVar4,(xmlNodePtr)attr,(char *)0x0);
          xmlSerializeHexCharRef(tmp,(uint)*pbVar6);
          xmlBufAdd(buf,tmp,-1);
          pbVar6 = string;
        }
      }
      else {
        pbVar6 = pbVar6 + 1;
      }
      goto LAB_001a809e;
    }
    if (string != pbVar6) {
      xmlBufAdd(buf,string,iVar5 - iVar4);
    }
  }
  return;
}

Assistant:

void
xmlBufAttrSerializeTxtContent(xmlBufPtr buf, xmlDocPtr doc,
                              xmlAttrPtr attr, const xmlChar * string)
{
    xmlChar *base, *cur;

    if (string == NULL)
        return;
    base = cur = (xmlChar *) string;
    while (*cur != 0) {
        if (*cur == '\n') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&#10;", 5);
            cur++;
            base = cur;
        } else if (*cur == '\r') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&#13;", 5);
            cur++;
            base = cur;
        } else if (*cur == '\t') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&#9;", 4);
            cur++;
            base = cur;
        } else if (*cur == '"') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&quot;", 6);
            cur++;
            base = cur;
        } else if (*cur == '<') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&lt;", 4);
            cur++;
            base = cur;
        } else if (*cur == '>') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&gt;", 4);
            cur++;
            base = cur;
        } else if (*cur == '&') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&amp;", 5);
            cur++;
            base = cur;
        } else if ((*cur >= 0x80) && (cur[1] != 0) &&
	           ((doc == NULL) || (doc->encoding == NULL))) {
            /*
             * We assume we have UTF-8 content.
             */
            unsigned char tmp[12];
            int val = 0, l = 1;

            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            if (*cur < 0xC0) {
                xmlSaveErr(XML_SAVE_NOT_UTF8, (xmlNodePtr) attr, NULL);
		xmlSerializeHexCharRef(tmp, *cur);
                xmlBufAdd(buf, (xmlChar *) tmp, -1);
                cur++;
                base = cur;
                continue;
            } else if (*cur < 0xE0) {
                val = (cur[0]) & 0x1F;
                val <<= 6;
                val |= (cur[1]) & 0x3F;
                l = 2;
            } else if ((*cur < 0xF0) && (cur [2] != 0)) {
                val = (cur[0]) & 0x0F;
                val <<= 6;
                val |= (cur[1]) & 0x3F;
                val <<= 6;
                val |= (cur[2]) & 0x3F;
                l = 3;
            } else if ((*cur < 0xF8) && (cur [2] != 0) && (cur[3] != 0)) {
                val = (cur[0]) & 0x07;
                val <<= 6;
                val |= (cur[1]) & 0x3F;
                val <<= 6;
                val |= (cur[2]) & 0x3F;
                val <<= 6;
                val |= (cur[3]) & 0x3F;
                l = 4;
            }
            if ((l == 1) || (!IS_CHAR(val))) {
                xmlSaveErr(XML_SAVE_CHAR_INVALID, (xmlNodePtr) attr, NULL);
		xmlSerializeHexCharRef(tmp, *cur);
                xmlBufAdd(buf, (xmlChar *) tmp, -1);
                cur++;
                base = cur;
                continue;
            }
            /*
             * We could do multiple things here. Just save
             * as a char ref
             */
	    xmlSerializeHexCharRef(tmp, val);
            xmlBufAdd(buf, (xmlChar *) tmp, -1);
            cur += l;
            base = cur;
        } else {
            cur++;
        }
    }
    if (base != cur)
        xmlBufAdd(buf, base, cur - base);
}